

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  uint uVar1;
  bool bVar2;
  Lexer *l;
  Parser *this;
  Program *obj;
  ostream *poVar3;
  Env *env;
  list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> evalStmts;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buffer_list;
  undefined1 local_a8 [32];
  Env *local_88;
  string local_80;
  _List_node_base local_60;
  undefined8 local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Welcome to BEESAFE :) REPL v1.0 ",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Type CTRL-D to Exit",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  local_88 = evaluator::Evaluator::NewEnvironment();
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">>",2);
    local_50 = 0;
    local_60._M_next = &local_60;
    local_60._M_prev = &local_60;
    read_lines((istream *)&std::cin,
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_60);
    env = (Env *)&std::cin;
    uVar1 = *(uint *)(_ITM_registerTMCloneTable + *(long *)(std::cin + -0x18));
    if ((uVar1 & 2) == 0) {
      join_lines(&local_80,
                 (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_60);
      l = lexer::Lexer::New(&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      this = parser::Parser::New(l);
      obj = parser::Parser::parseProgram(this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Parse -> ",9);
      poVar3 = ast::operator<<((ostream *)&std::cout,obj);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      bVar2 = parser::Parser::hasErrors(this);
      if (bVar2) {
        parser::Parser::Errors_abi_cxx11_(&local_48,this);
        spitParseErrors(&local_48);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
      }
      else {
        evaluator::Evaluator::evalProgram_abi_cxx11_
                  ((list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)
                   local_a8,(Evaluator *)obj,(Program *)local_88,env);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"evaluated statement size: ",0x1a);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Eval -> ",8);
        poVar3 = symbols::operator<<((ostream *)&std::cout,
                                     (Object *)((_List_node_base *)(local_a8._0_8_ + 0x10))->_M_next
                                    );
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        std::__cxx11::_List_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>::
        _M_clear((_List_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)
                 local_a8);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      randomMessageGen_abi_cxx11_();
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_a8._0_8_,local_a8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"...",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((_List_node_base *)local_a8._0_8_ != (_List_node_base *)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_60);
  } while ((uVar1 & 2) == 0);
  return 0;
}

Assistant:

int main()
{
    cout << "Welcome to BEESAFE :) REPL v1.0 " << endl;
    cout << "Type CTRL-D to Exit" << endl;
    auto env = Evaluator::NewEnvironment();
    while (true){
        cout << PROMPT;
        list<string> buffer_list;
        read_lines(cin, buffer_list );
        if(cin.eof()){
            cout << "\t" << randomMessageGen() << "..." << endl;
            break;
        }
        auto l = lexer::Lexer::New(join_lines(buffer_list));
        auto p = parser::Parser::New(l);
        auto program = p->parseProgram();
        cout << "Parse -> "<< program << endl;
        if (!p->hasErrors()){
            auto evalStmts = Evaluator::evalProgram(program, env);
            cout << "evaluated statement size: " << evalStmts.size() << endl;
            cout << "Eval -> " << evalStmts.front() << endl;
        }else{
            spitParseErrors(p->Errors());
        }
    }
}